

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O2

void __thiscall deqp::egl::ColorClearThread::run(ColorClearThread *this)

{
  vector<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_> *pvVar1;
  pointer pCVar2;
  long lVar3;
  
  pvVar1 = this->m_packets;
  for (pCVar2 = (pvVar1->
                super__Vector_base<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 != (pvVar1->
                super__Vector_base<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>)
                ._M_impl.super__Vector_impl_data._M_finish; pCVar2 = pCVar2 + 1) {
    de::Semaphore::decrement((pCVar2->wait).m_ptr);
    (*this->m_egl->_vptr_Library[0x27])
              (this->m_egl,this->m_display,this->m_surface,this->m_surface,this->m_context);
    lVar3 = 0;
    while( true ) {
      if (lVar3 == 0x28) break;
      renderClear(this->m_api,this->m_funcs,(ClearOp *)((long)&pCVar2->clears[0].x + lVar3));
      lVar3 = lVar3 + 0x14;
    }
    finish(this->m_api,this->m_funcs);
    (*this->m_egl->_vptr_Library[0x27])(this->m_egl,this->m_display,0,0,0);
    de::Semaphore::increment((pCVar2->signal).m_ptr);
    pvVar1 = this->m_packets;
  }
  return;
}

Assistant:

void run (void)
	{
		for (std::vector<ClearPacket>::const_iterator packetIter = m_packets.begin(); packetIter != m_packets.end(); packetIter++)
		{
			// Wait until it is our turn.
			packetIter->wait->decrement();

			// Acquire context.
			m_egl.makeCurrent(m_display, m_surface, m_surface, m_context);

			// Execute clears.
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(packetIter->clears); ndx++)
				renderClear(m_api, m_funcs, packetIter->clears[ndx]);

			finish(m_api, m_funcs);
			// Release context.
			m_egl.makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);

			// Signal completion.
			packetIter->signal->increment();
		}
	}